

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O3

void deqp::gls::anon_unknown_1::render
               (TestLog *log,RenderContext *renderContext,RenderBits renderBits,Random *rng,
               ShaderProgram *program,TextureBuffer *texture,PixelBufferAccess *target)

{
  ulong uVar1;
  ostringstream *this;
  _func_int *__s;
  RenderContext *pRVar2;
  ShaderProgram *pSVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ObjectTraits *pOVar8;
  undefined4 extraout_var_03;
  ulong uVar9;
  char **__args;
  TextureBuffer *pTVar10;
  char *pcVar11;
  VertexShader *pVVar12;
  long lVar13;
  ulong uVar14;
  int maxTextureBufferSize;
  ScopedLogSection renderSection;
  vector<const_char_*,_std::allocator<const_char_*>_> usedAs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coords_1;
  anon_struct_16_2_44180aad bitInfos [4];
  VertexAttrib vertexAttribs [1];
  Random rng_1;
  Program program_1;
  ConstPixelBufferAccess effectiveAccess;
  Random rng_2;
  CoordFragmentShader coordFragmmentShader;
  PrimitiveList primitives;
  ostringstream stream;
  VertexArray vao;
  undefined1 auStack_5b8 [15];
  Renderer local_5a9;
  deUint32 local_5a8;
  int local_5a4;
  TextureBuffer *local_5a0;
  RenderContext *local_598;
  ScopedLogSection local_590;
  VertexShader local_588;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_548;
  TestLog *local_528;
  RenderBits aRStack_520 [2];
  VertexShader local_518;
  TextureFormat TStack_4e0;
  int aiStack_4d8 [2];
  int local_4d0;
  int local_4cc [2];
  int local_4c4;
  void *local_4c0;
  ShaderProgram *local_4b0;
  VertexAttrib local_4a8;
  FragmentShader local_478;
  TextureFormat local_440;
  int local_438 [2];
  int local_430;
  int local_42c [2];
  int local_424;
  void *local_420;
  Program local_418;
  ConstPixelBufferAccess local_400;
  DrawCommand local_3d8;
  FragmentShader local_3a8;
  MultisamplePixelBufferAccess local_370;
  undefined1 local_348 [16];
  undefined1 local_338 [96];
  ios_base local_2d8 [72];
  undefined8 local_290;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 local_274;
  undefined1 local_270;
  undefined8 local_26c;
  TextureFormat local_1c8;
  RenderTarget *pRStack_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  local_598 = renderContext;
  local_528 = log;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Render Texture buffer","");
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"Render Texture Buffer","");
  tcu::ScopedLogSection::ScopedLogSection
            (&local_590,local_528,(string *)local_1b0,(string *)local_348);
  if ((undefined1 *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,
                    CONCAT44(local_1a0[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1a0[0]._M_allocated_capacity) + 1);
  }
  local_5a8 = deRandom_getUint32(&rng->m_rnd);
  pRVar2 = local_598;
  local_5a4 = 0;
  iVar4 = (*local_598->_vptr_RenderContext[3])(local_598);
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))(0x8c2b,&local_5a4);
  iVar4 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  dVar5 = (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x800))();
  glu::checkError(dVar5,"query GL_MAX_TEXTURE_BUFFER_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x303);
  local_518.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x8;
  TStack_4e0 = (TextureFormat)0x1cb419d;
  local_518.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000004;
  local_518.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1cb418e;
  local_518.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_518.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1cb4182;
  local_518._vptr_VertexShader = (_func_int **)&DAT_00000001;
  local_518.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1cb4175;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  local_588._vptr_VertexShader = (_func_int **)0x0;
  local_588.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar13 = 8;
  do {
    if ((*(RenderBits *)((long)aRStack_520 + lVar13) & renderBits) != RENDERBITS_NONE) {
      __args = (char **)((long)&local_518._vptr_VertexShader + lVar13);
      if (local_588.m_inputs.
          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_588.m_inputs.
          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_588,
                   (iterator)
                   local_588.m_inputs.
                   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start,__args);
      }
      else {
        *(char **)local_588.m_inputs.
                  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start = *__args;
        local_588.m_inputs.
        super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)local_588.m_inputs.
                             super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8);
      }
    }
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x48);
  local_5a0 = texture;
  local_4b0 = program;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"Render using texture buffer as ",0x1f);
  uVar9 = (ulong)((long)local_588.m_inputs.
                        super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                 (long)local_588._vptr_VertexShader) >> 3;
  if (0 < (int)uVar9) {
    uVar14 = 0;
    do {
      uVar1 = uVar14 + 1;
      lVar13 = 5;
      pcVar11 = " and ";
      if ((int)uVar9 < 2 || uVar1 != (uVar9 & 0xffffffff)) {
        lVar13 = 2;
        pcVar11 = ", ";
        if (uVar14 != 0) goto LAB_0189578a;
      }
      else {
LAB_0189578a:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar11,lVar13);
      }
      __s = local_588._vptr_VertexShader[uVar14];
      if (__s == (_func_int *)0x0) {
        std::ios::clear((int)(auStack_5b8 + *(long *)(local_348._0_8_ + -0x18)) + 0x270);
      }
      else {
        sVar7 = strlen((char *)__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,(char *)__s,sVar7);
      }
      uVar9 = (ulong)((long)local_588.m_inputs.
                            super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start -
                     (long)local_588._vptr_VertexShader) >> 3;
      uVar14 = uVar1;
    } while ((long)uVar1 < (long)(int)uVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,".",1);
  this = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = local_528;
  std::__cxx11::ostringstream::ostringstream(this);
  pSVar3 = local_4b0;
  pTVar10 = local_5a0;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(char *)local_478._vptr_FragmentShader,
             (long)local_478.m_inputs.
                   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((pointer *)local_478._vptr_FragmentShader !=
      &local_478.m_inputs.
       super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete(local_478._vptr_FragmentShader,
                    (ulong)((long)&(local_478.m_inputs.
                                    super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->type + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_138);
  if (local_588._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(local_588._vptr_VertexShader,
                    (long)local_588.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_588._vptr_VertexShader);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  pRVar2 = local_598;
  iVar4 = (*local_598->_vptr_RenderContext[3])(local_598);
  lVar13 = CONCAT44(extraout_var_01,iVar4);
  iVar4 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  pOVar8 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_1b0,(Functions *)CONCAT44(extraout_var_02,iVar4),pOVar8);
  iVar4 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  pOVar8 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_348,(Functions *)CONCAT44(extraout_var_03,iVar4),pOVar8);
  (**(code **)(lVar13 + 0x1680))((pSVar3->m_program).m_program);
  (**(code **)(lVar13 + 0xd8))((undefined4)local_1a0[0]._M_allocated_capacity);
  (**(code **)(lVar13 + 0x610))(0);
  if ((renderBits & RENDERBITS_AS_VERTEX_ARRAY) == RENDERBITS_NONE) {
    deRandom_init((deRandom *)&local_478,local_5a8);
    local_518._vptr_VertexShader = (_func_int **)0x0;
    local_518.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_518.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_588._vptr_VertexShader = local_478._vptr_FragmentShader;
    local_588.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_478.m_inputs.
                  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    genRandomCoords((Random *)&local_588,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_518,0,0x200);
    (**(code **)(lVar13 + 0x40))(0x8892,local_338._0_8_ & 0xffffffff);
    (**(code **)(lVar13 + 0x150))
              (0x8892,(long)((int)local_518.m_inputs.
                                  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start -
                            (int)local_518._vptr_VertexShader),local_518._vptr_VertexShader,0x88e0);
    (**(code **)(lVar13 + 0x19f0))(0,2,0x1401,1,0,0);
    if (local_518._vptr_VertexShader != (_func_int **)0x0) {
      operator_delete(local_518._vptr_VertexShader,
                      (long)local_518.m_inputs.
                            super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_518._vptr_VertexShader);
    }
  }
  else {
    (**(code **)(lVar13 + 0x40))(0x8892,pTVar10->m_glBuffer);
    (**(code **)(lVar13 + 0x19f0))(0,2,0x1401,1,0,0);
  }
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    uVar6 = (**(code **)(lVar13 + 0xb48))((pSVar3->m_program).m_program,"u_vtxSampler");
    (**(code **)(lVar13 + 8))(0x84c0);
    (**(code **)(lVar13 + 0xb8))(0x8c2a,pTVar10->m_glTexture);
    (**(code **)(lVar13 + 0x14f0))(uVar6,0);
  }
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    uVar6 = (**(code **)(lVar13 + 0xb48))((pSVar3->m_program).m_program,"u_fragSampler");
    (**(code **)(lVar13 + 8))(0x84c1);
    (**(code **)(lVar13 + 0xb8))(0x8c2a,pTVar10->m_glTexture);
    (**(code **)(lVar13 + 0x14f0))(uVar6,1);
    (**(code **)(lVar13 + 8))(0x84c0);
  }
  if ((renderBits & RENDERBITS_AS_INDEX_ARRAY) == RENDERBITS_NONE) {
    (**(code **)(lVar13 + 0x538))(4,0,0x18);
  }
  else {
    (**(code **)(lVar13 + 0x40))(0x8893,pTVar10->m_glBuffer);
    (**(code **)(lVar13 + 0x568))(4,0x18,0x1401,0);
    (**(code **)(lVar13 + 0x40))(0x8893,0);
  }
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    (**(code **)(lVar13 + 8))(0x84c1);
    (**(code **)(lVar13 + 0xb8))(0x8c2a,0);
  }
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    (**(code **)(lVar13 + 8))(0x84c0);
    (**(code **)(lVar13 + 0xb8))(0x8c2a,0);
  }
  (**(code **)(lVar13 + 0x40))(0x8892,0);
  (**(code **)(lVar13 + 0x518))(0);
  (**(code **)(lVar13 + 0xd8))(0);
  (**(code **)(lVar13 + 0x1680))(0);
  dVar5 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar5,"Rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x28d);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_348);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_1b0);
  glu::getTextureBufferEffectiveRefTexture(&local_400,pTVar10,local_5a4);
  rr::VertexShader::VertexShader(&local_588,1,1);
  local_588._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_0217cfe0;
  (local_588.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_588.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::VertexShader::VertexShader(&local_518,1,1);
  local_518._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_0217d010;
  TStack_4e0 = local_400.m_format;
  aiStack_4d8[0] = local_400.m_size.m_data[0];
  aiStack_4d8[1] = local_400.m_size.m_data[1];
  local_4d0 = local_400.m_size.m_data[2];
  local_4cc[0] = local_400.m_pitch.m_data[0];
  local_4cc[1] = local_400.m_pitch.m_data[1];
  local_4c4 = local_400.m_pitch.m_data[2];
  local_4c0 = local_400.m_data;
  (local_518.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_518.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  pVVar12 = &local_518;
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) == RENDERBITS_NONE) {
    pVVar12 = &local_588;
  }
  rr::FragmentShader::FragmentShader(&local_3a8,1,1);
  local_3a8._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_0217d040;
  (local_3a8.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_3a8.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&local_478,1,1);
  local_478._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_0217d070;
  local_440 = local_400.m_format;
  local_438[0] = local_400.m_size.m_data[0];
  local_438[1] = local_400.m_size.m_data[1];
  local_430 = local_400.m_size.m_data[2];
  local_424 = local_400.m_pitch.m_data[2];
  local_42c[0] = local_400.m_pitch.m_data[0];
  local_42c[1] = local_400.m_pitch.m_data[1];
  local_420 = local_400.m_data;
  (local_478.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_478.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_418.fragmentShader = &local_478;
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) == RENDERBITS_NONE) {
    local_418.fragmentShader = &local_3a8;
  }
  rr::Renderer::Renderer(&local_5a9);
  local_528 = *(TestLog **)(target->super_ConstPixelBufferAccess).m_size.m_data;
  aRStack_520[0] = RENDERBITS_NONE;
  aRStack_520[1] = RENDERBITS_NONE;
  local_348._0_8_ = (pointer)0x100000000;
  local_348._8_8_ = (ObjectTraits *)0x0;
  local_338._0_8_ = 0x200000001;
  rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)(local_338 + 8));
  local_290 = 0x3f800000;
  local_288 = 0;
  local_284 = local_528._0_4_;
  uStack_280 = local_528._4_4_;
  uStack_27c = 0;
  uStack_278 = 0x3f800000;
  local_274 = 0x3f800000;
  local_270 = 0;
  local_26c = 0xffffffff;
  local_338._0_8_ = local_338._0_8_ & 0xffffffff;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&local_3d8,target);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_4a8);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_370);
  rr::RenderTarget::RenderTarget
            ((RenderTarget *)local_1b0,(MultisamplePixelBufferAccess *)&local_3d8,
             (MultisamplePixelBufferAccess *)&local_4a8,&local_370);
  local_418.geometryShader = (GeometryShader *)0x0;
  local_4a8.generic.v._8_8_ = 0;
  local_4a8.pointer = (void *)0x0;
  local_4a8.generic.v._0_8_ = 0;
  local_4a8.type = VERTEXATTRIBTYPE_FLOAT;
  local_4a8.size = 0;
  local_4a8.stride = 0;
  local_4a8.instanceDivisor = 0;
  local_548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.vertexShader = pVVar12;
  if ((renderBits & RENDERBITS_AS_VERTEX_ARRAY) == RENDERBITS_NONE) {
    deRandom_init((deRandom *)&local_3d8,local_5a8);
    pTVar10 = local_5a0;
    local_1c8 = (TextureFormat)local_3d8.state;
    pRStack_1c0 = local_3d8.renderTarget;
    genRandomCoords((Random *)&local_1c8,&local_548,0,0x200);
    local_4a8.pointer =
         local_548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  else {
    local_4a8.pointer = (local_5a0->m_refBuffer).m_ptr;
    pTVar10 = local_5a0;
  }
  local_4a8.type = VERTEXATTRIBTYPE_NONPURE_UNORM8;
  local_4a8.size = 2;
  local_3d8.state = (RenderState *)local_348;
  local_3d8.renderTarget = (RenderTarget *)local_1b0;
  local_3d8.vertexAttribs = &local_4a8;
  if ((renderBits & RENDERBITS_AS_INDEX_ARRAY) == RENDERBITS_NONE) {
    rr::PrimitiveList::PrimitiveList((PrimitiveList *)&local_370,PRIMITIVETYPE_TRIANGLES,0x18,0);
    local_3d8.program = &local_418;
    local_3d8.numVertexAttribs = 1;
    local_3d8.primitives = (PrimitiveList *)&local_370;
    rr::Renderer::draw(&local_5a9,&local_3d8);
  }
  else {
    rr::DrawIndices::DrawIndices
              ((DrawIndices *)&local_3d8,(pTVar10->m_refBuffer).m_ptr,INDEXTYPE_UINT8,0);
    rr::PrimitiveList::PrimitiveList
              ((PrimitiveList *)&local_370,PRIMITIVETYPE_TRIANGLES,0x18,(DrawIndices *)&local_3d8);
    local_3d8.program = &local_418;
    local_3d8.numVertexAttribs = 1;
    local_3d8.primitives = (PrimitiveList *)&local_370;
    rr::Renderer::draw(&local_5a9,&local_3d8);
  }
  if (local_548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_548.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  rr::Renderer::~Renderer(&local_5a9);
  rr::FragmentShader::~FragmentShader(&local_478);
  rr::FragmentShader::~FragmentShader(&local_3a8);
  rr::VertexShader::~VertexShader(&local_518);
  rr::VertexShader::~VertexShader(&local_588);
  tcu::TestLog::endSection(local_590.m_log);
  return;
}

Assistant:

void render (TestLog&						log,
			 glu::RenderContext&			renderContext,
			 RenderBits						renderBits,
			 de::Random&					rng,
			 glu::ShaderProgram&			program,
			 glu::TextureBuffer&			texture,
			 const tcu::PixelBufferAccess&	target)
{
	const tcu::ScopedLogSection	renderSection			(log, "Render Texture buffer", "Render Texture Buffer");
	const int					triangleCount			= 8;
	const deUint32				coordSeed				= rng.getUint32();
	int							maxTextureBufferSize	= 0;

	renderContext.getFunctions().getIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE, &maxTextureBufferSize);
	GLU_EXPECT_NO_ERROR(renderContext.getFunctions().getError(), "query GL_MAX_TEXTURE_BUFFER_SIZE");
	DE_ASSERT(maxTextureBufferSize > 0); // checked in init()

	logRendering(log, renderBits);

	renderGL(renderContext, renderBits, coordSeed, triangleCount, program, texture);
	renderReference(renderBits, coordSeed, triangleCount, texture, maxTextureBufferSize, target);
}